

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Node::DumpAscii(Node *this,ostream *s,int indent)

{
  Node *this_00;
  
  BeginAscii(this,s,indent);
  this_00 = this;
  DumpPropertiesAscii(this,s,indent);
  if ((this->force_has_children != false) ||
     ((this->children).super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->children).super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    std::__ostream_insert<char,std::char_traits<char>>(s," {",2);
    this_00 = this;
    DumpChildrenAscii(this,s,indent + 1);
  }
  EndAscii(this_00,s,indent,
           (bool)((this->children).
                  super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  (this->children).
                  super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
                  super__Vector_impl_data._M_finish | this->force_has_children));
  return;
}

Assistant:

void FBX::Node::DumpAscii(std::ostream &s, int indent)
{
    // write name
    BeginAscii(s, indent);

    // write properties
    DumpPropertiesAscii(s, indent);

    if (force_has_children || !children.empty()) {
        // begin children (with a '{')
        BeginChildrenAscii(s, indent + 1);
        // write children
        DumpChildrenAscii(s, indent + 1);
    }

    // finish (also closing the children bracket '}')
    EndAscii(s, indent, force_has_children || !children.empty());
}